

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

Gia_Man_t * Sbd_ManDerive(Sbd_Man_t *pMan,Gia_Man_t *p,Vec_Int_t *vMirrors)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  undefined8 uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  uint *puVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *p_01;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  if (p->pMuxes != (uint *)0x0) {
    puVar10 = (uint *)calloc((long)p->nObjs,4);
    p_00->pMuxes = puVar10;
  }
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      iVar1 = pVVar12->pArray[lVar15];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0053e66e;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_0053e64f;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_0053e64f;
      pGVar4[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar12 = p->vCis;
    } while (lVar15 < pVVar12->nSize);
  }
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      iVar1 = pVVar12->pArray[lVar15];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0053e66e;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Sbd_ManDerive_rec(p_00,p,iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff),vMirrors);
      lVar15 = lVar15 + 1;
      pVVar12 = p->vCos;
    } while (lVar15 < pVVar12->nSize);
  }
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      iVar1 = pVVar12->pArray[lVar15];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0053e66e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar1;
      uVar7 = *(undefined8 *)pGVar4;
      uVar2 = pGVar4[-(ulong)((uint)uVar7 & 0x1fffffff)].Value;
      if ((int)uVar2 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar14 = uVar2 >> 1;
      if (p_00->nObjs <= (int)uVar14) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(p_00->pObjs + uVar14) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar14) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x80000000;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_0053e64f:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar13 = (ulong)(((uint)((int)pGVar11 - (int)pGVar6) >> 2) * -0x55555555 - uVar14 & 0x1fffffff
                      );
      uVar16 = (ulong)((uVar2 << 0x1d ^ (uint)uVar7) & 0x20000000);
      *(ulong *)pGVar11 = uVar16 | uVar5 & 0xffffffffc0000000 | 0x80000000 | uVar13;
      *(ulong *)pGVar11 =
           uVar16 | uVar5 & 0xe0000000c0000000 | 0x80000000 | uVar13 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_0053e64f;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11)
        ;
      }
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_0053e64f;
      pGVar4->Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar12 = p->vCos;
    } while (lVar15 < pVVar12->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManTransferTiming(p_00,p);
  if (pMan->pPars->fMapping != 0) {
    Sbd_ManDeriveMapping(pMan,p_00);
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManTransferTiming(p_01,p_00);
  Gia_ManTransferMapping(p_01,p_00);
  Gia_ManStop(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Sbd_ManDerive( Sbd_Man_t * pMan, Gia_Man_t * p, Vec_Int_t * vMirrors )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( p->pMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        Sbd_ManDerive_rec( pNew, p, Gia_ObjFaninId0p(p, pObj), vMirrors );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManTransferTiming( pNew, p );
    if ( pMan->pPars->fMapping )
        Sbd_ManDeriveMapping( pMan, pNew );
    // remove dangling nodes
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManTransferMapping( pNew, pTemp );
    Gia_ManStop( pTemp );
    return pNew;
}